

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O0

bool __thiscall llvm::APInt::ult(APInt *this,uint64_t RHS)

{
  bool bVar1;
  uint uVar2;
  uint64_t uVar3;
  uint64_t RHS_local;
  APInt *this_local;
  
  bVar1 = isSingleWord(this);
  if ((!bVar1) && (uVar2 = getActiveBits(this), 0x40 < uVar2)) {
    return false;
  }
  uVar3 = getZExtValue(this);
  return uVar3 < RHS;
}

Assistant:

bool ult(uint64_t RHS) const {
    // Only need to check active bits if not a single word.
    return (isSingleWord() || getActiveBits() <= 64) && getZExtValue() < RHS;
  }